

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_listener_get_url(nng_listener id,nng_url **urlp)

{
  int iVar1;
  nng_url *pnVar2;
  nni_listener *local_20;
  nni_listener *l;
  
  iVar1 = nni_listener_find(&local_20,id.id);
  if (iVar1 == 0) {
    pnVar2 = nni_listener_url(local_20);
    *urlp = pnVar2;
    nni_listener_rele(local_20);
  }
  return iVar1;
}

Assistant:

int
nng_listener_get_url(nng_listener id, const nng_url **urlp)
{
	int           rv;
	nni_listener *l;
	if ((rv = nni_listener_find(&l, id.id)) != 0) {
		return (rv);
	}
	*urlp = nni_listener_url(l);
	nni_listener_rele(l);
	return (0);
}